

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_device(int nargs,char **args)

{
  int iVar1;
  uint uVar2;
  size_t sVar3;
  long in_RSI;
  int in_EDI;
  int prefix;
  char *source;
  char tmp [64];
  int len;
  char *s;
  uint gid;
  char *pcVar4;
  char *in_stack_ffffffffffffffa8;
  undefined4 local_4;
  unsigned_short prefix_00;
  
  s = *(char **)(in_RSI + 8);
  gid = 0;
  if (in_EDI == 5) {
    sVar3 = strlen(*(char **)(in_RSI + 8));
    iVar1 = (int)sVar3 + -1;
    if (*(char *)(*(long *)(in_RSI + 8) + (long)iVar1) == '*') {
      *(undefined1 *)(*(long *)(in_RSI + 8) + (long)iVar1) = 0;
      gid = 1;
    }
    pcVar4 = s;
    get_mode(*(char **)(in_RSI + 0x10));
    uVar2 = decode_uid(s);
    prefix_00 = (unsigned_short)(uVar2 >> 0x10);
    decode_uid(s);
    add_devperms_partners
              (in_stack_ffffffffffffffa8,(mode_t)((ulong)pcVar4 >> 0x20),(uint)pcVar4,gid,prefix_00)
    ;
    local_4 = 0;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int do_device(int nargs, char **args) {
    int len;
    char tmp[64];
    char *source = args[1];
    int prefix = 0;

    if (nargs != 5)
        return -1;
    /* Check for wildcard '*' at the end which indicates a prefix. */
    len = strlen(args[1]) - 1;
    if (args[1][len] == '*') {
        args[1][len] = '\0';
        prefix = 1;
    }
    /* If path starts with mtd@ lookup the mount number. */
    /*if (!strncmp(source, "mtd@", 4)) {
        int n = mtd_name_to_number(source + 4);
        if (n >= 0) {
            snprintf(tmp, sizeof(tmp), "/dev/mtd/mtd%d", n);
            source = tmp;
        }
    }*/
    add_devperms_partners(source, get_mode(args[2]), decode_uid(args[3]),
                          decode_uid(args[4]), prefix);
    return 0;
}